

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O2

void __thiscall InputInterfaceToStream::~InputInterfaceToStream(InputInterfaceToStream *this)

{
  ~InputInterfaceToStream((InputInterfaceToStream *)&this[-1].mPos);
  return;
}

Assistant:

virtual ~InputInterfaceToStream(){}